

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

floatx80 float128_to_floatx80_arm(float128 a,float_status *status)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  floatx80 fVar4;
  int32_t aExp;
  uint64_t local_50;
  ulong local_48;
  commonNaNT local_40;
  
  local_50 = a.low;
  local_48 = a.high & 0xffffffffffff;
  aExp = a.high._6_2_ & 0x7fff;
  uVar1 = a.high._4_4_ >> 0x1f;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_50 != 0) {
      normalizeFloat128Subnormal(local_48,local_50,&aExp,&local_48,&local_50);
      uVar3 = local_48;
      goto LAB_0050dd3a;
    }
    uVar2 = (ulong)(uVar1 << 0xf);
    uVar3 = 0;
  }
  else {
    if (aExp != 0x7fff) {
      uVar3 = local_48 + 0x1000000000000;
LAB_0050dd3a:
      fVar4 = roundAndPackFloatx80_arm
                        ('P',a.high._7_1_ >> 7,aExp,uVar3 << 0xf | local_50 >> 0x31,local_50 << 0xf,
                         status);
      return fVar4;
    }
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_50 == 0) {
      uVar2 = (ulong)(uVar1 << 0xf | 0x7fff);
      uVar3 = 0x8000000000000000;
    }
    else {
      uVar3 = 0xc000000000000000;
      float128ToCommonNaN(&local_40,a,status);
      uVar2 = 0xffff;
      if ((status->default_nan_mode == '\0') && (1 < local_40.high)) {
        uVar3 = local_40.high >> 1 | 0x8000000000000000;
        uVar2 = (ulong)(local_40._0_4_ << 0xf | 0x7fff);
      }
    }
  }
  fVar4._8_8_ = uVar2;
  fVar4.low = uVar3;
  return fVar4;
}

Assistant:

floatx80 float128_to_floatx80(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloatx80(float128ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    else {
        aSig0 |= UINT64_C(0x0001000000000000);
    }
    shortShift128Left( aSig0, aSig1, 15, &aSig0, &aSig1 );
    return roundAndPackFloatx80(80, aSign, aExp, aSig0, aSig1, status);

}